

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

bool __thiscall S2Polyline::NearlyCovers(S2Polyline *this,S2Polyline *covered,S1Angle max_error)

{
  double dVar1;
  double dVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  _Rb_tree_color k;
  _Base_ptr p_Var5;
  pointer pSVar6;
  int iVar7;
  S2Point *pSVar8;
  S2Point *pSVar9;
  S2Point *b;
  _Rb_tree_node_base *p_Var10;
  _Link_type p_Var11;
  long lVar12;
  _Rb_tree_color _Var13;
  _Rb_tree_node_base *p_Var14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  _Link_type p_Var18;
  bool bVar19;
  bool bVar20;
  S2Point j_begin;
  S2Point closest_point;
  vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
  pending;
  set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
  done;
  undefined1 local_e0 [8];
  bool bStack_d8;
  undefined7 uStack_d7;
  _Base_ptr local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
  local_88;
  S1Angle local_70;
  S1Angle local_68 [2];
  _Rb_tree_node_base local_58;
  long local_38;
  
  if (covered->num_vertices_ == 0) {
    bVar19 = true;
  }
  else {
    if (this->num_vertices_ != 0) {
      local_88.
      super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var18 = (_Link_type)0x0;
      local_88.
      super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58._M_left = &local_58;
      local_58._M_color = _S_red;
      local_58._M_parent = (_Base_ptr)0x0;
      local_38 = 0;
      p_Var11 = (_Link_type)0x0;
      local_70.radians_ = max_error.radians_;
      local_58._M_right = local_58._M_left;
      pSVar8 = vertex(this,0);
      do {
        uVar16 = (int)p_Var18 + 1;
        p_Var18 = (_Link_type)(ulong)uVar16;
        iVar7 = this->num_vertices_;
        if (iVar7 <= (int)uVar16) goto LAB_0020f4a5;
        p_Var11 = (_Link_type)(ulong)uVar16;
        pSVar9 = vertex(this,uVar16);
        lVar12 = 0;
        do {
          dVar1 = *(double *)((long)pSVar9->c_ + lVar12);
          dVar2 = *(double *)((long)pSVar8->c_ + lVar12);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar19 = lVar12 != 0x10;
          lVar12 = lVar12 + 8;
        } while (bVar19);
      } while ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2)));
      iVar7 = this->num_vertices_;
LAB_0020f4a5:
      if ((int)uVar16 < iVar7) {
        uVar16 = 0;
        do {
          p_Var11 = p_Var18;
          uVar15 = (uint)p_Var11;
          pSVar8 = vertex(this,uVar15);
          p_Var18 = p_Var11;
          while( true ) {
            uVar17 = (int)p_Var18 + 1;
            p_Var18 = (_Link_type)(ulong)uVar17;
            if (this->num_vertices_ <= (int)uVar17) break;
            pSVar9 = vertex(this,uVar17);
            lVar12 = 0;
            do {
              dVar1 = *(double *)((long)pSVar9->c_ + lVar12);
              dVar2 = *(double *)((long)pSVar8->c_ + lVar12);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar19 = lVar12 != 0x10;
              lVar12 = lVar12 + 8;
            } while (bVar19);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          }
          pSVar8 = vertex(covered,0);
          pSVar9 = vertex(this,uVar16);
          b = vertex(this,uVar15);
          S2::Project((S2Point *)local_a8,pSVar8,pSVar9,b);
          if (uVar17 == this->num_vertices_) {
LAB_0020f57c:
            pSVar8 = vertex(covered,0);
            p_Var11 = (_Link_type)local_a8;
            S1Angle::S1Angle(local_68,(S2Point *)p_Var11,pSVar8);
            if (local_68[0].radians_ <= local_70.radians_) {
              local_c8._4_4_ = 0;
              local_c8._0_4_ = uVar16;
              local_c8[8] = 1;
              p_Var11 = (_Link_type)local_c8;
              std::
              vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
              ::push_back(&local_88,(value_type *)p_Var11);
            }
          }
          else {
            pSVar8 = vertex(this,uVar15);
            lVar12 = 0;
            do {
              dVar1 = *(double *)(local_a8 + lVar12);
              dVar2 = *(double *)((long)pSVar8->c_ + lVar12);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar19 = lVar12 != 0x10;
              lVar12 = lVar12 + 8;
            } while (bVar19);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0020f57c;
          }
          uVar16 = uVar15;
        } while ((int)uVar17 < this->num_vertices_);
LAB_0020f960:
        while (local_88.
               super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_88.
               super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          k = local_88.
              super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].i;
          uVar16 = local_88.
                   super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].j;
          bVar19 = local_88.
                   super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].i_in_progress;
          uVar3 = local_88.
                  super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].field_0xb;
          uVar4 = *(undefined2 *)
                   &local_88.
                    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].field_0x9;
          local_88.
          super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          p_Var14 = &local_58;
          p_Var5 = local_58._M_parent;
joined_r0x0020f61f:
          if (p_Var5 != (_Base_ptr)0x0) {
            do {
              p_Var10 = p_Var5;
              _Var13 = p_Var10[1]._M_color;
              bVar20 = SBORROW4(k,_Var13);
              iVar7 = k - _Var13;
              p_Var14 = p_Var10;
              if (k == _Var13) {
                uVar15 = *(uint *)&p_Var10[1].field_0x4;
                bVar20 = SBORROW4(uVar16,uVar15);
                iVar7 = uVar16 - uVar15;
                if (uVar16 != uVar15) goto LAB_0020f648;
                if (bVar19 < *(byte *)&p_Var10[1]._M_parent) goto LAB_0020f64a;
              }
              else {
LAB_0020f648:
                if (bVar20 != iVar7 < 0) goto LAB_0020f64a;
              }
              p_Var5 = p_Var10->_M_right;
              if (p_Var10->_M_right == (_Base_ptr)0x0) goto LAB_0020f669;
            } while( true );
          }
          if (p_Var14 == local_58._M_left) goto LAB_0020f684;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var14);
          _Var13 = p_Var10[1]._M_color;
LAB_0020f669:
          bVar20 = SBORROW4(_Var13,k);
          iVar7 = _Var13 - k;
          if (_Var13 != k) goto LAB_0020f67e;
          uVar15 = *(uint *)&p_Var10[1].field_0x4;
          bVar20 = SBORROW4(uVar15,uVar16);
          iVar7 = uVar15 - uVar16;
          if (uVar15 != uVar16) goto LAB_0020f67e;
          if (*(byte *)&p_Var10[1]._M_parent < bVar19) goto LAB_0020f684;
        }
        bVar19 = false;
LAB_0020f993:
        pSVar6 = local_88.
                 super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        _Rb_tree<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchState,_std::_Identity<(anonymous_namespace)::SearchState>,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
        ::_M_erase((_Rb_tree<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchState,_std::_Identity<(anonymous_namespace)::SearchState>,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
                    *)local_58._M_parent,p_Var11);
        if (pSVar6 == (pointer)0x0) {
          return bVar19;
        }
        operator_delete(pSVar6);
        return bVar19;
      }
      std::
      _Rb_tree<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchState,_std::_Identity<(anonymous_namespace)::SearchState>,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::_M_erase((_Rb_tree<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchState,_std::_Identity<(anonymous_namespace)::SearchState>,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
                  *)local_58._M_parent,p_Var11);
    }
    bVar19 = false;
  }
  return bVar19;
LAB_0020f64a:
  p_Var5 = p_Var10->_M_left;
  goto joined_r0x0020f61f;
LAB_0020f67e:
  if (bVar20 == iVar7 < 0) goto LAB_0020f960;
LAB_0020f684:
  if (&local_58 == p_Var14) {
    bVar20 = true;
  }
  else {
    _Var13 = p_Var14[1]._M_color;
    bVar20 = SBORROW4(k,_Var13);
    iVar7 = k - _Var13;
    if (k == _Var13) {
      uVar15 = *(uint *)&p_Var14[1].field_0x4;
      bVar20 = SBORROW4(uVar16,uVar15);
      iVar7 = uVar16 - uVar15;
      if (uVar16 == uVar15) {
        bVar20 = bVar19 < *(byte *)&p_Var14[1]._M_parent;
        goto LAB_0020f6bd;
      }
    }
    bVar20 = bVar20 != iVar7 < 0;
  }
LAB_0020f6bd:
  p_Var10 = (_Rb_tree_node_base *)operator_new(0x30);
  p_Var10[1]._M_color = k;
  *(uint *)&p_Var10[1].field_0x4 = uVar16;
  *(bool *)&p_Var10[1]._M_parent = bVar19;
  *(undefined2 *)((long)&p_Var10[1]._M_parent + 1) = uVar4;
  *(undefined1 *)((long)&p_Var10[1]._M_parent + 3) = uVar3;
  std::_Rb_tree_insert_and_rebalance(bVar20,p_Var10,p_Var14,&local_58);
  local_38 = local_38 + 1;
  pSVar8 = vertex(this,k);
  _Var13 = k;
  while (_Var13 = _Var13 + _S_black, (int)_Var13 < this->num_vertices_) {
    pSVar9 = vertex(this,_Var13);
    lVar12 = 0;
    do {
      dVar1 = *(double *)((long)pSVar9->c_ + lVar12);
      dVar2 = *(double *)((long)pSVar8->c_ + lVar12);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar20 = lVar12 != 0x10;
      lVar12 = lVar12 + 8;
    } while (bVar20);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
  }
  p_Var11 = (_Link_type)(ulong)uVar16;
  pSVar8 = vertex(covered,uVar16);
  uVar15 = uVar16;
  do {
    uVar15 = uVar15 + 1;
    uVar17 = covered->num_vertices_;
    if ((int)uVar17 <= (int)uVar15) goto LAB_0020f7a8;
    p_Var11 = (_Link_type)(ulong)uVar15;
    pSVar9 = vertex(covered,uVar15);
    lVar12 = 0;
    do {
      dVar1 = *(double *)((long)pSVar9->c_ + lVar12);
      dVar2 = *(double *)((long)pSVar8->c_ + lVar12);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar20 = lVar12 != 0x10;
      lVar12 = lVar12 + 8;
    } while (bVar20);
  } while ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2)));
  uVar17 = covered->num_vertices_;
LAB_0020f7a8:
  if (uVar15 == uVar17) {
    bVar19 = true;
    goto LAB_0020f993;
  }
  if (_Var13 != this->num_vertices_) {
    local_a8._0_8_ = 0.0;
    local_a8._8_8_ = (_Base_ptr)0x0;
    local_a8._16_8_ = (_Base_ptr)0x0;
    local_c8._16_8_ = (_Base_ptr)0x0;
    local_c8._0_8_ = (_Base_ptr)0x0;
    local_c8._8_8_ = (_Base_ptr)0x0;
    if ((bVar19 & 1U) == 0) {
      pSVar8 = vertex(this,k);
      local_a8._16_8_ = pSVar8->c_[2];
      local_a8._0_8_ = pSVar8->c_[0];
      local_a8._8_8_ = pSVar8->c_[1];
      pSVar8 = vertex(covered,uVar16);
      pSVar9 = vertex(covered,uVar15);
      S2::Project((S2Point *)local_e0,(S2Point *)local_a8,pSVar8,pSVar9);
      local_c8._16_8_ = local_d0;
      local_c8._0_8_ = CONCAT44(local_e0._4_4_,local_e0._0_4_);
      local_c8._8_8_ = CONCAT71(uStack_d7,bStack_d8);
    }
    else {
      pSVar8 = vertex(covered,uVar16);
      local_c8._16_8_ = pSVar8->c_[2];
      local_c8._0_8_ = pSVar8->c_[0];
      local_c8._8_8_ = pSVar8->c_[1];
      pSVar8 = vertex(this,k);
      pSVar9 = vertex(this,_Var13);
      S2::Project((S2Point *)local_e0,(S2Point *)local_c8,pSVar8,pSVar9);
      local_a8._16_8_ = local_d0;
      local_a8._0_8_ = CONCAT44(local_e0._4_4_,local_e0._0_4_);
      local_a8._8_8_ = CONCAT71(uStack_d7,bStack_d8);
    }
    pSVar8 = vertex(covered,uVar15);
    pSVar9 = vertex(this,_Var13);
    bVar19 = S2::IsEdgeBNearEdgeA((S2Point *)local_c8,pSVar8,(S2Point *)local_a8,pSVar9,local_70);
    if (bVar19) {
      bStack_d8 = false;
      local_e0._0_4_ = _Var13;
      local_e0._4_4_ = uVar16;
      std::
      vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::push_back(&local_88,(value_type *)local_e0);
    }
    p_Var11 = (_Link_type)vertex(this,_Var13);
    pSVar8 = vertex(covered,uVar15);
    bVar19 = S2::IsEdgeBNearEdgeA
                       ((S2Point *)local_a8,(S2Point *)p_Var11,(S2Point *)local_c8,pSVar8,local_70);
    if (bVar19) {
      bStack_d8 = true;
      p_Var11 = (_Link_type)local_e0;
      local_e0._0_4_ = k;
      local_e0._4_4_ = uVar15;
      std::
      vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::push_back(&local_88,(value_type *)p_Var11);
    }
  }
  goto LAB_0020f960;
}

Assistant:

bool S2Polyline::NearlyCovers(const S2Polyline& covered,
                              S1Angle max_error) const {
  // NOTE: This algorithm is described assuming that adjacent vertices in a
  // polyline are never at the same point.  That is, the ith and i+1th vertices
  // of a polyline are never at the same point in space.  The implementation
  // does not make this assumption.

  // DEFINITIONS:
  //   - edge "i" of a polyline is the edge from the ith to i+1th vertex.
  //   - covered_j is a polyline consisting of edges 0 through j of "covered."
  //   - this_i is a polyline consisting of edges 0 through i of this polyline.
  //
  // A search state is represented as an (int, int, bool) tuple, (i, j,
  // i_in_progress).  Using the "drive a car" analogy from the header comment, a
  // search state signifies that you can drive one car along "covered" from its
  // first vertex through a point on its jth edge, and another car along this
  // polyline from some point on or before its ith edge to a to a point on its
  // ith edge, such that no car ever goes backward, and the cars are always
  // within "max_error" of each other.  If i_in_progress is true, it means that
  // you can definitely drive along "covered" through the jth vertex (beginning
  // of the jth edge). Otherwise, you can definitely drive along "covered"
  // through the point on the jth edge of "covered" closest to the ith vertex of
  // this polyline.
  //
  // The algorithm begins by finding all edges of this polyline that are within
  // "max_error" of the first vertex of "covered," and adding search states
  // representing all of these possible starting states to the stack of
  // "pending" states.
  //
  // The algorithm proceeds by popping the next pending state,
  // (i,j,i_in_progress), off of the stack.  First it checks to see if that
  // state represents finding a valid covering of "covered" and returns true if
  // so.  Next, if the state represents reaching the end of this polyline
  // without finding a successful covering, the algorithm moves on to the next
  // state in the stack.  Otherwise, if state (i+1,j,false) is valid, it is
  // added to the stack of pending states.  Same for state (i,j+1,true).
  //
  // We need the stack because when "i" and "j" can both be incremented,
  // sometimes only one choice leads to a solution.  We use a set to keep track
  // of visited states to avoid duplicating work.  With the set, the worst-case
  // number of states examined is O(n+m) where n = this->num_vertices() and m =
  // covered.num_vertices().  Without it, the amount of work could be as high as
  // O((n*m)^2).  Using set, the running time is O((n*m) log (n*m)).
  //
  // TODO(user): Benchmark this, and see if the set is worth it.

  if (covered.num_vertices() == 0) return true;
  if (this->num_vertices() == 0) return false;

  vector<SearchState> pending;
  set<SearchState, SearchStateKeyCompare> done;

  // Find all possible starting states.
  for (int i = 0, next_i = NextDistinctVertex(*this, 0), next_next_i;
       next_i < this->num_vertices(); i = next_i, next_i = next_next_i) {
    next_next_i = NextDistinctVertex(*this, next_i);
    S2Point closest_point = S2::Project(
        covered.vertex(0), this->vertex(i), this->vertex(next_i));

    // In order to avoid duplicate starting states, we exclude the end vertex
    // of each edge *except* for the last non-degenerate edge.
    if ((next_next_i == this->num_vertices() ||
         closest_point != this->vertex(next_i)) &&
        S1Angle(closest_point, covered.vertex(0)) <= max_error) {
      pending.push_back(SearchState(i, 0, true));
    }
  }

  while (!pending.empty()) {
    const SearchState state = pending.back();
    pending.pop_back();
    if (!done.insert(state).second) continue;

    const int next_i = NextDistinctVertex(*this, state.i);
    const int next_j = NextDistinctVertex(covered, state.j);
    if (next_j == covered.num_vertices()) {
      return true;
    } else if (next_i == this->num_vertices()) {
      continue;
    }

    S2Point i_begin, j_begin;
    if (state.i_in_progress) {
      j_begin = covered.vertex(state.j);
      i_begin = S2::Project(
          j_begin, this->vertex(state.i), this->vertex(next_i));
    } else {
      i_begin = this->vertex(state.i);
      j_begin = S2::Project(
          i_begin, covered.vertex(state.j), covered.vertex(next_j));
    }

    if (S2::IsEdgeBNearEdgeA(j_begin, covered.vertex(next_j),
                             i_begin, this->vertex(next_i), max_error)) {
      pending.push_back(SearchState(next_i, state.j, false));
    }
    if (S2::IsEdgeBNearEdgeA(i_begin, this->vertex(next_i),
                             j_begin, covered.vertex(next_j), max_error)) {
      pending.push_back(SearchState(state.i, next_j, true));
    }
  }
  return false;
}